

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O0

int reverse_d(int dir)

{
  int newDir;
  int dir_local;
  
  switch(dir) {
  case 0:
    newDir = 2;
    break;
  case 1:
    newDir = 3;
    break;
  case 2:
    newDir = 0;
    break;
  case 3:
    newDir = 1;
    break;
  case 4:
    newDir = 5;
    break;
  case 5:
    newDir = 4;
    break;
  default:
    newDir = 0;
  }
  return newDir;
}

Assistant:

int reverse_d(int dir)
{
	int newDir = 0;
	switch(dir)
	{
		case Directions::North:
			newDir = Directions::South;
			break;
		case Directions::South:
			newDir = Directions::North;
			break;
		case Directions::West:
			newDir = Directions::East;
			break;
		case Directions::East:
			newDir = Directions::West;
			break;
		case Directions::Up: 
			newDir = Directions::Down;
			break;
		case Directions::Down:
			newDir = Directions::Up;
			break;
		default:
			newDir = Directions::North;
			break;
	}
	return newDir;
}